

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

int __thiscall spirv_cross::CompilerGLSL::init(CompilerGLSL *this,EVP_PKEY_CTX *ctx)

{
  char cVar1;
  char *pcVar2;
  
  if ((this->super_Compiler).ir.source.known == true) {
    (this->options).es = (this->super_Compiler).ir.source.es;
    (this->options).version = (this->super_Compiler).ir.source.version;
  }
  pcVar2 = nl_langinfo(0x10000);
  if (pcVar2 != (char *)0x0) {
    cVar1 = *pcVar2;
    pcVar2 = (char *)CONCAT71((int7)((ulong)pcVar2 >> 8),cVar1);
    if (cVar1 != '\0') {
      this->current_locale_radix_character = cVar1;
    }
  }
  return (int)pcVar2;
}

Assistant:

void CompilerGLSL::init()
{
	if (ir.source.known)
	{
		options.es = ir.source.es;
		options.version = ir.source.version;
	}

	// Query the locale to see what the decimal point is.
	// We'll rely on fixing it up ourselves in the rare case we have a comma-as-decimal locale
	// rather than setting locales ourselves. Settings locales in a safe and isolated way is rather
	// tricky.
#ifdef _WIN32
	// On Windows, localeconv uses thread-local storage, so it should be fine.
	const struct lconv *conv = localeconv();
	if (conv && conv->decimal_point)
		current_locale_radix_character = *conv->decimal_point;
#elif defined(__ANDROID__) && __ANDROID_API__ < 26
	// nl_langinfo is not supported on this platform, fall back to the worse alternative.
	const struct lconv *conv = localeconv();
	if (conv && conv->decimal_point)
		current_locale_radix_character = *conv->decimal_point;
#else
	// localeconv, the portable function is not MT safe ...
	const char *decimal_point = nl_langinfo(RADIXCHAR);
	if (decimal_point && *decimal_point != '\0')
		current_locale_radix_character = *decimal_point;
#endif
}